

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFAcroFormDocumentHelper::traverseField
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *field,QPDFObjectHandle *parent,
          int depth,set *visited)

{
  bool bVar1;
  __index_type _Var2;
  bool bVar3;
  bool bVar4;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar5;
  iterator iVar6;
  iterator iVar7;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *this_00;
  mapped_type *pmVar8;
  iterator iVar9;
  mapped_type *this_01;
  mapped_type *pmVar10;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_02;
  QPDFObjectHandle *pQVar11;
  element_type *peVar12;
  QPDFFormFieldObjectHelper foh;
  QPDFObjectHandle our_field;
  Array a;
  string old_name;
  QPDFObjGen og;
  QPDFFormFieldObjectHelper local_118;
  QPDFAcroFormDocumentHelper *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Array local_b8;
  string local_a0;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle *local_40;
  QPDFObjGen local_38;
  
  if (100 < depth) {
    return;
  }
  local_e0 = this;
  bVar1 = QPDFObjectHandle::isIndirect(field);
  if (!bVar1) {
    local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,
               "encountered a direct object as a field or annotation while traversing /AcroForm; ignoring field or annotation"
               ,"");
    QPDFObjectHandle::warnIfPossible(field,(string *)&local_118);
LAB_0014f98d:
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
        &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete(local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    return;
  }
  bVar1 = QPDFObjectHandle::isDictionary(field);
  if (!bVar1) {
    local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,
               "encountered a non-dictionary as a field or annotation while traversing /AcroForm; ignoring field or annotation"
               ,"");
    QPDFObjectHandle::warnIfPossible(field,(string *)&local_118);
    goto LAB_0014f98d;
  }
  local_38 = QPDFObjectHandle::getObjGen(field);
  bVar1 = QPDFObjGen::set::add(visited,local_38);
  if (!bVar1) {
    local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"loop detected while traversing /AcroForm","");
    QPDFObjectHandle::warnIfPossible(field,(string *)&local_118);
    goto LAB_0014f98d;
  }
  local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
       (_func_int **)
       &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d8,(string *)field);
  if ((element_type *)local_d8._0_8_ != (element_type *)0x0) {
    _Var2 = *(__index_type *)(local_d8._0_8_ + 0x30);
    if (_Var2 == '\x0f') {
      pvVar5 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           *)local_d8._0_8_);
LAB_0014f9ba:
      _Var2 = *(__index_type *)
               ((long)&(((pvVar5->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 0x30);
    }
    else if (_Var2 == '\r') {
      pvVar5 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(*(QPDF **)(local_d8._0_8_ + 0x48),
                                *(QPDFObjGen *)(local_d8._0_8_ + 0x50));
      goto LAB_0014f9ba;
    }
    if (_Var2 == '\b') {
      local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_d8._0_8_;
      local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
        }
      }
      goto LAB_0014f9fa;
    }
  }
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0014f9fa:
  local_b8.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
      &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_40 = parent;
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Parent","");
    bVar1 = QPDFObjectHandle::hasKey(field,(string *)&local_118);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
        &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete(local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Subtype","");
    bVar3 = QPDFObjectHandle::hasKey(field,(string *)&local_118);
    bVar4 = true;
    if (!bVar3) {
      local_d8._0_8_ = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"/Rect","");
      bVar3 = QPDFObjectHandle::hasKey(field,(string *)local_d8);
      bVar4 = true;
      if (!bVar3) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/AP","");
        bVar4 = QPDFObjectHandle::hasKey(field,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          (ulong)(local_a0.field_2._M_allocated_capacity + 1));
        }
      }
      if ((element_type *)local_d8._0_8_ != (element_type *)local_c8) {
        operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
      }
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
        &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete(local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    bVar1 = depth == 0 || bVar1;
  }
  else {
    iVar6 = ::qpdf::Array::begin((Array *)(local_c8 + 0x10));
    iVar7 = ::qpdf::Array::end((Array *)(local_c8 + 0x10));
    if (iVar6._M_current != iVar7._M_current) {
      do {
        local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = ((iVar6._M_current)->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             ((iVar6._M_current)->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_50.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_50.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_50.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_50.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (field->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (field->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_60.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_60.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        traverseField(local_e0,&local_50,&local_60,depth + 1,visited);
        if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        iVar6._M_current = iVar6._M_current + 1;
      } while (iVar6._M_current != iVar7._M_current);
    }
    bVar4 = false;
    bVar1 = true;
  }
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr(&local_b8.sp_elements);
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (bVar4 != false) {
    pQVar11 = local_40;
    if (bVar1) {
      pQVar11 = field;
    }
    local_d8._0_8_ =
         (pQVar11->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_d8._8_8_ =
         (pQVar11->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
      }
    }
    peVar12 = (local_e0->m).
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_d8);
    this_00 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *)
              std::
              map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
              ::operator[](&peVar12->field_to_annotations,(key_type *)&local_118);
    std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
    emplace_back<QPDFObjectHandle&>(this_00,field);
    local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_d8._0_8_;
    local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
      }
    }
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_118,&local_70);
    pmVar8 = std::
             map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
             ::operator[](&((local_e0->m).
                            super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->annotation_to_field,&local_38);
    (pmVar8->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar8->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (pmVar8->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_118.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar8->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_118.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
    (pmVar8->m).super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_118.m.
             super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar8->m).
                super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_118.m.
                super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_118);
    if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  if (!bVar1) {
    return;
  }
  local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
       (_func_int **)
       &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/T","");
  bVar1 = QPDFObjectHandle::hasKey(field,(string *)&local_118);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
      &local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_118.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_118.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (!bVar1) {
    return;
  }
  local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (field->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (field->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((QPDFObjGen)
      local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (QPDFObjGen)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_80.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8) =
           *(_Atomic_word *)
            ((long)local_80.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8)
           + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_80.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8) =
           *(_Atomic_word *)
            ((long)local_80.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8)
           + 1;
    }
  }
  QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_118,&local_80);
  if ((QPDFObjGen)
      local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (QPDFObjGen)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QPDFObjectHandle::getObjGen(field);
  QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_((string *)local_d8,&local_118);
  iVar9 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(((local_e0->m).
                    super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->field_to_name)._M_t,(key_type *)(local_c8 + 0x10));
  peVar12 = (local_e0->m).
            super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((_Rb_tree_header *)iVar9._M_node !=
      &(peVar12->field_to_name)._M_t._M_impl.super__Rb_tree_header) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,iVar9._M_node[1]._M_parent,
               (long)&(iVar9._M_node[1]._M_parent)->_M_color +
               (long)&(iVar9._M_node[1]._M_left)->_M_color);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
              ::operator[](&((local_e0->m).
                             super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->name_to_fields,&local_a0);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::erase
              (this_01,(key_type *)(local_c8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1))
      ;
    }
    peVar12 = (local_e0->m).
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  }
  pmVar10 = std::
            map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&peVar12->field_to_name,(key_type *)(local_c8 + 0x10));
  std::__cxx11::string::_M_assign((string *)pmVar10);
  this_02 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
               ::operator[](&((local_e0->m).
                              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->name_to_fields,(key_type *)local_d8);
  std::
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  ::_M_insert_unique<QPDFObjGen_const&>(this_02,(QPDFObjGen *)(local_c8 + 0x10));
  if ((element_type *)local_d8._0_8_ != (element_type *)local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_118);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::traverseField(
    QPDFObjectHandle field, QPDFObjectHandle parent, int depth, QPDFObjGen::set& visited)
{
    if (depth > 100) {
        // Arbitrarily cut off recursion at a fixed depth to avoid specially crafted files that
        // could cause stack overflow.
        return;
    }
    if (!field.isIndirect()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper direct field");
        field.warnIfPossible(
            "encountered a direct object as a field or annotation while "
            "traversing /AcroForm; ignoring field or annotation");
        return;
    }
    if (!field.isDictionary()) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper non-dictionary field");
        field.warnIfPossible(
            "encountered a non-dictionary as a field or annotation while"
            " traversing /AcroForm; ignoring field or annotation");
        return;
    }
    QPDFObjGen og(field.getObjGen());
    if (!visited.add(og)) {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper loop");
        field.warnIfPossible("loop detected while traversing /AcroForm");
        return;
    }

    // A dictionary encountered while traversing the /AcroForm field may be a form field, an
    // annotation, or the merger of the two. A field that has no fields below it is a terminal. If a
    // terminal field looks like an annotation, it is an annotation because annotation dictionary
    // fields can be merged with terminal field dictionaries. Otherwise, the annotation fields might
    // be there to be inherited by annotations below it.

    bool is_annotation = false;
    bool is_field = (0 == depth);
    if (auto a = field.getKey("/Kids").as_array(strict)) {
        is_field = true;
        for (auto const& item: a) {
            traverseField(item, field, 1 + depth, visited);
        }
    } else {
        if (field.hasKey("/Parent")) {
            is_field = true;
        }
        if (field.hasKey("/Subtype") || field.hasKey("/Rect") || field.hasKey("/AP")) {
            is_annotation = true;
        }
    }

    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper field found", (depth == 0) ? 0 : 1);
    QTC::TC("qpdf", "QPDFAcroFormDocumentHelper annotation found", (is_field ? 0 : 1));

    if (is_annotation) {
        QPDFObjectHandle our_field = (is_field ? field : parent);
        m->field_to_annotations[our_field.getObjGen()].emplace_back(field);
        m->annotation_to_field[og] = QPDFFormFieldObjectHelper(our_field);
    }

    if (is_field && (field.hasKey("/T"))) {
        QPDFFormFieldObjectHelper foh(field);
        auto f_og = field.getObjGen();
        std::string name = foh.getFullyQualifiedName();
        auto old = m->field_to_name.find(f_og);
        if (old != m->field_to_name.end()) {
            // We might be updating after a name change, so remove any old information
            std::string old_name = old->second;
            m->name_to_fields[old_name].erase(f_og);
        }
        m->field_to_name[f_og] = name;
        m->name_to_fields[name].insert(f_og);
    }
}